

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ** __thiscall
google::protobuf::(anonymous_namespace)::
FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
::AllocateArray<std::__cxx11::string_const*>
          (FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
           *this,int array_size)

{
  long lVar1;
  int iVar2;
  int extraout_EAX;
  Nonnull<const_char_*> pcVar3;
  undefined4 in_register_00000034;
  long v2;
  long unaff_R14;
  FlatAllocatorImpl<char,std::__cxx11::string,google::protobuf::SourceCodeInfo,google::protobuf::FileDescriptorTables,google::protobuf::FeatureSet,google::protobuf::MessageOptions,google::protobuf::FieldOptions,google::protobuf::EnumOptions,google::protobuf::EnumValueOptions,google::protobuf::ExtensionRangeOptions,google::protobuf::OneofOptions,google::protobuf::ServiceOptions,google::protobuf::MethodOptions,google::protobuf::FileOptions>
  local_20 [16];
  
  v2 = CONCAT44(in_register_00000034,array_size);
  lVar1 = *(long *)this;
  if (lVar1 == 0) {
    AllocateArray<std::__cxx11::string_const*>(local_20);
    iVar2 = extraout_EAX;
  }
  else {
    unaff_R14 = (long)*(int *)(this + 0xa8);
    iVar2 = *(int *)(this + 0xa8) + array_size * 8;
    *(int *)(this + 0xa8) = iVar2;
    v2 = (long)*(int *)(this + 0x70);
    if (iVar2 <= *(int *)(this + 0x70)) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
      goto LAB_00163942;
    }
  }
  pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                     ((long)iVar2,v2,"used <= total_.template Get<TypeToUse>()");
LAB_00163942:
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(lVar1 + unaff_R14)
    ;
  }
  AllocateArray<std::__cxx11::string_const*>();
}

Assistant:

U* AllocateArray(int array_size) {
    constexpr bool trivial = std::is_trivially_destructible<U>::value;
    using TypeToUse = typename std::conditional<trivial, char, U>::type;

    // We can only allocate after FinalizePlanning has been called.
    ABSL_CHECK(has_allocated());

    TypeToUse*& data = pointers_.template Get<TypeToUse>();
    int& used = used_.template Get<TypeToUse>();
    U* res = reinterpret_cast<U*>(data + used);
    used += trivial ? RoundUpTo<8>(array_size * sizeof(U)) : array_size;
    ABSL_CHECK_LE(used, total_.template Get<TypeToUse>());
    return res;
  }